

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O1

bool __thiscall QFileDevice::setPermissions(QFileDevice *this,Permissions permissions)

{
  QIODevicePrivate *pQVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).d_ptr._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  iVar3 = (*pQVar1->_vptr_QIODevicePrivate[5])(pQVar1);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xb8))
                    ((long *)CONCAT44(extraout_var,iVar3));
  if (cVar2 == '\0') {
    QAbstractFileEngine::errorString
              (&local_38,(QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
    *(undefined4 *)((long)&pQVar1[1].devicePos + 4) = 0xd;
    QString::operator=(&pQVar1->errorString,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    QFileDevicePrivate::setError
              ((QFileDevicePrivate *)
               (this->super_QIODevice).d_ptr._M_t.
               super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
               super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
               super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl,NoError);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::setPermissions(Permissions permissions)
{
    Q_D(QFileDevice);
    if (d->engine()->setPermissions(permissions.toInt())) {
        unsetError();
        return true;
    }
    d->setError(QFile::PermissionsError, d->fileEngine->errorString());
    return false;
}